

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool google::protobuf::internal::MapFieldPrinterHelper::SortMap
               (Message *message,Reflection *reflection,FieldDescriptor *field,
               vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *sorted_map_field)

{
  pointer *pppMVar1;
  iterator __position;
  __normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
  __first;
  __normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
  __last;
  NodeBase *__comp;
  bool bVar2;
  bool bVar3;
  MapFieldBase *this;
  RepeatedPtrFieldBase *this_00;
  MessageFactory *pMVar4;
  undefined4 extraout_var;
  MessageLite *pMVar5;
  string *psVar6;
  Descriptor *pDVar7;
  long lVar8;
  Message **__buffer;
  int iVar9;
  pair<const_google::protobuf::Message_**,_long> pVar10;
  Message *map_entry_message;
  MapEntryMessageComparator comparator;
  MessageLite *local_f8;
  FieldDescriptor *local_f0;
  MessageLite *local_e8;
  MapIterator local_e0;
  MapIterator local_88;
  
  this = Reflection::GetMapData(reflection,message,field);
  bVar2 = MapFieldBase::IsRepeatedFieldValid(this);
  local_f0 = field;
  if (bVar2) {
    iVar9 = 0;
    this_00 = (RepeatedPtrFieldBase *)
              Reflection::GetRawRepeatedField
                        (reflection,message,field,CPPTYPE_MESSAGE,-1,(Descriptor *)0x0);
    if (0 < this_00->current_size_) {
      do {
        local_e0.iter_.node_ =
             (NodeBase *)
             RepeatedPtrFieldBase::
             Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                       (this_00,iVar9);
        std::
        vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
        emplace_back<google::protobuf::Message_const*>
                  ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                    *)sorted_map_field,(Message **)&local_e0);
        iVar9 = iVar9 + 1;
      } while (iVar9 < this_00->current_size_);
    }
  }
  else {
    pDVar7 = FieldDescriptor::message_type(field);
    pMVar4 = Reflection::GetMessageFactory(reflection);
    iVar9 = (*pMVar4->_vptr_MessageFactory[2])(pMVar4,pDVar7);
    local_e8 = (MessageLite *)CONCAT44(extraout_var,iVar9);
    Reflection::MapBegin(&local_e0,reflection,message,field);
    while( true ) {
      Reflection::MapEnd(&local_88,reflection,message,local_f0);
      bVar3 = MapFieldBase::EqualIterator(local_e0.map_,&local_e0,&local_88);
      if ((local_88.key_.type_ == CPPTYPE_STRING) &&
         (local_88.key_.val_._0_8_ != (undefined1 *)((long)&local_88.key_.val_ + 0x10))) {
        operator_delete((void *)local_88.key_.val_.int64_value,local_88.key_.val_._16_8_ + 1);
      }
      if (bVar3) break;
      pMVar5 = MessageLite::New(local_e8,(Arena *)0x0);
      local_f8 = pMVar5;
      if ((long)pDVar7->field_count_ < 1) {
        psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (0,(long)pDVar7->field_count_,"index < field_count()");
      }
      else {
        psVar6 = (string *)0x0;
      }
      if (psVar6 != (string *)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                   ,0x9f4,*(undefined8 *)(psVar6 + 8),*(undefined8 *)psVar6);
        goto LAB_003048f0;
      }
      CopyKey(&local_e0.key_,(Message *)pMVar5,pDVar7->fields_);
      pMVar5 = local_f8;
      if ((long)pDVar7->field_count_ < 2) {
        psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (1,(long)pDVar7->field_count_,"index < field_count()");
      }
      else {
        psVar6 = (string *)0x0;
      }
      if (psVar6 != (string *)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                   ,0x9f4,*(undefined8 *)(psVar6 + 8),*(undefined8 *)psVar6);
LAB_003048f0:
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_88);
      }
      CopyValue(&local_e0.value_,(Message *)pMVar5,pDVar7->fields_ + 1);
      __position._M_current =
           (sorted_map_field->
           super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (sorted_map_field->
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
        _M_realloc_insert<google::protobuf::Message_const*const&>
                  ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                    *)sorted_map_field,__position,(Message **)&local_f8);
      }
      else {
        *__position._M_current = (Message *)local_f8;
        pppMVar1 = &(sorted_map_field->
                    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppMVar1 = *pppMVar1 + 1;
      }
      MapFieldBase::IncreaseIterator(local_e0.map_,&local_e0);
    }
    if ((local_e0.key_.type_ == CPPTYPE_STRING) &&
       (local_e0.key_.val_._0_8_ != (undefined1 *)((long)&local_e0.key_.val_ + 0x10))) {
      operator_delete((void *)local_e0.key_.val_.int64_value,local_e0.key_.val_._16_8_ + 1);
    }
  }
  pDVar7 = FieldDescriptor::message_type(local_f0);
  MapEntryMessageComparator::MapEntryMessageComparator
            ((MapEntryMessageComparator *)&local_e0,pDVar7);
  __comp = local_e0.iter_.node_;
  __first._M_current =
       (sorted_map_field->
       super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (sorted_map_field->
       super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    lVar8 = (long)__last._M_current - (long)__first._M_current >> 3;
    pVar10 = std::get_temporary_buffer<google::protobuf::Message_const*>
                       ((lVar8 - (lVar8 + 1 >> 0x3f)) + 1 >> 1);
    lVar8 = pVar10.second;
    __buffer = pVar10.first;
    if (__buffer == (Message **)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::Message_const**,std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>>
                (__first,__last,(_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>)__comp
                );
      lVar8 = 0;
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<google::protobuf::Message_const**,std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>>,google::protobuf::Message_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>>
                (__first,__last,__buffer,lVar8,
                 (_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>)__comp);
    }
    operator_delete(__buffer,lVar8 << 3);
  }
  return !bVar2;
}

Assistant:

bool MapFieldPrinterHelper::SortMap(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field,
    std::vector<const Message*>* sorted_map_field) {
  bool need_release = false;
  const MapFieldBase& base = *reflection->GetMapData(message, field);

  if (base.IsRepeatedFieldValid()) {
    const RepeatedPtrField<Message>& map_field =
        reflection->GetRepeatedPtrFieldInternal<Message>(message, field);
    for (int i = 0; i < map_field.size(); ++i) {
      sorted_map_field->push_back(
          const_cast<RepeatedPtrField<Message>*>(&map_field)->Mutable(i));
    }
  } else {
    // TODO: For performance, instead of creating map entry message
    // for each element, just store map keys and sort them.
    const Descriptor* map_entry_desc = field->message_type();
    const Message* prototype =
        reflection->GetMessageFactory()->GetPrototype(map_entry_desc);
    for (MapIterator iter =
             reflection->MapBegin(const_cast<Message*>(&message), field);
         iter != reflection->MapEnd(const_cast<Message*>(&message), field);
         ++iter) {
      Message* map_entry_message = prototype->New();
      CopyKey(iter.GetKey(), map_entry_message, map_entry_desc->field(0));
      CopyValue(iter.GetValueRef(), map_entry_message,
                map_entry_desc->field(1));
      sorted_map_field->push_back(map_entry_message);
    }
    need_release = true;
  }

  MapEntryMessageComparator comparator(field->message_type());
  std::stable_sort(sorted_map_field->begin(), sorted_map_field->end(),
                   comparator);
  return need_release;
}